

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O2

void __thiscall
soplex::
SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  type_conflict5 tVar7;
  int iVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar10;
  Item *pIVar11;
  long lVar12;
  bool bVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  len;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bias;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_23;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (this->state == DVEC) {
    lVar9 = (long)(this->vec).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->vec).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    arg = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)(lVar9 % 0x38);
    iVar8 = (int)(lVar9 / 0x38);
    if ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum != iVar8) goto LAB_002a7c3d;
    eps.m_backend.fpclass = cpp_dec_float_finite;
    eps.m_backend.prec_elem = 10;
    eps.m_backend.data._M_elems[0] = 0;
    eps.m_backend.data._M_elems[1] = 0;
    eps.m_backend.data._M_elems[2] = 0;
    eps.m_backend.data._M_elems[3] = 0;
    eps.m_backend.data._M_elems[4] = 0;
    eps.m_backend.data._M_elems[5] = 0;
    eps.m_backend.data._M_elems._24_5_ = 0;
    eps.m_backend.data._M_elems[7]._1_3_ = 0;
    eps.m_backend.data._M_elems._32_5_ = 0;
    eps.m_backend.data._M_elems[9]._1_3_ = 0;
    eps.m_backend.exp = 0;
    eps.m_backend.neg = false;
    bias.m_backend.fpclass = cpp_dec_float_finite;
    bias.m_backend.prec_elem = 10;
    bias.m_backend.data._M_elems[0] = 0;
    bias.m_backend.data._M_elems[1] = 0;
    bias.m_backend.data._M_elems[2] = 0;
    bias.m_backend.data._M_elems[3] = 0;
    bias.m_backend.data._M_elems[4] = 0;
    bias.m_backend.data._M_elems[5] = 0;
    bias.m_backend.data._M_elems._24_5_ = 0;
    bias.m_backend.data._M_elems[7]._1_3_ = 0;
    bias.m_backend.data._M_elems._32_5_ = 0;
    bias.m_backend.data._M_elems[9]._1_3_ = 0;
    bias.m_backend.exp = 0;
    bias.m_backend.neg = false;
    len.m_backend.fpclass = cpp_dec_float_finite;
    len.m_backend.prec_elem = 10;
    len.m_backend.data._M_elems[0] = 0;
    len.m_backend.data._M_elems[1] = 0;
    len.m_backend.data._M_elems[2] = 0;
    len.m_backend.data._M_elems[3] = 0;
    len.m_backend.data._M_elems[4] = 0;
    len.m_backend.data._M_elems[5] = 0;
    len.m_backend.data._M_elems._24_5_ = 0;
    len.m_backend.data._M_elems[7]._1_3_ = 0;
    len.m_backend.data._M_elems._32_5_ = 0;
    len.m_backend.data._M_elems[9]._1_3_ = 0;
    len.m_backend.exp = 0;
    len.m_backend.neg = false;
    lVar10 = (long)iVar8;
    lVar9 = lVar10 * 0x38;
    while( true ) {
      bVar13 = lVar10 == 0;
      lVar10 = lVar10 + -1;
      if (bVar13) break;
      pnVar3 = (this->vec).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c8 = *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar9 + 0x20);
      puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar9);
      local_e8 = *puVar1;
      uStack_e0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar9 + 0x10);
      local_d8 = *puVar1;
      uStack_d0 = puVar1[1];
      local_c0 = *(undefined4 *)((long)&pnVar3[-1].m_backend.data + lVar9 + 0x28);
      local_bc = *(undefined1 *)((long)&pnVar3[-1].m_backend.data + lVar9 + 0x2c);
      local_b8 = *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar9 + 0x30);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)&result_20.m_backend,(multiprecision *)&local_e8,arg);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)
                 ((long)&(this->
                         super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).rowWeight.data.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9),
                 &result_20.m_backend);
      arg = extraout_RDX;
      lVar9 = lVar9 + -0x38;
    }
    lVar9 = (long)(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    while (bVar13 = lVar9 != 0, lVar9 = lVar9 + -1, bVar13) {
      pIVar4 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar8 = (base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar9].idx;
      pIVar11 = pIVar4 + iVar8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&len.m_backend,0);
      bias.m_backend.data._M_elems[0] = len.m_backend.data._M_elems[0];
      bias.m_backend.data._M_elems[1] = len.m_backend.data._M_elems[1];
      bias.m_backend.data._M_elems[2] = len.m_backend.data._M_elems[2];
      bias.m_backend.data._M_elems[3] = len.m_backend.data._M_elems[3];
      bias.m_backend.data._M_elems[4] = len.m_backend.data._M_elems[4];
      bias.m_backend.data._M_elems[5] = len.m_backend.data._M_elems[5];
      bias.m_backend.data._M_elems._24_5_ = len.m_backend.data._M_elems._24_5_;
      bias.m_backend.data._M_elems[7]._1_3_ = len.m_backend.data._M_elems[7]._1_3_;
      bias.m_backend.data._M_elems._32_5_ = len.m_backend.data._M_elems._32_5_;
      bias.m_backend.data._M_elems[9]._1_3_ = len.m_backend.data._M_elems[9]._1_3_;
      bias.m_backend.exp = len.m_backend.exp;
      bias.m_backend.neg = len.m_backend.neg;
      bias.m_backend.fpclass = len.m_backend.fpclass;
      bias.m_backend.prec_elem = len.m_backend.prec_elem;
      lVar10 = (long)pIVar4[iVar8].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      lVar12 = lVar10 * 0x3c;
      while (bVar13 = lVar10 != 0, lVar10 = lVar10 + -1, bVar13) {
        pNVar5 = (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        uVar6 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x1c);
        eps.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
        eps.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        puVar2 = (uint *)((long)&pNVar5[-1].val.m_backend.data + lVar12);
        eps.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
        eps.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x2c);
        eps.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar6 = *(undefined8 *)(puVar2 + 2);
        eps.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        eps.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        eps.m_backend.exp = *(int *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x14);
        eps.m_backend.neg = *(bool *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x10);
        eps.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0xc);
        result_20.m_backend.fpclass = cpp_dec_float_finite;
        result_20.m_backend.prec_elem = 10;
        result_20.m_backend.data._M_elems[0] = 0;
        result_20.m_backend.data._M_elems[1] = 0;
        result_20.m_backend.data._M_elems[2] = 0;
        result_20.m_backend.data._M_elems[3] = 0;
        result_20.m_backend.data._M_elems[4] = 0;
        result_20.m_backend.data._M_elems[5] = 0;
        result_20.m_backend.data._M_elems._24_5_ = 0;
        result_20.m_backend.data._M_elems[7]._1_3_ = 0;
        result_20.m_backend.data._M_elems._32_5_ = 0;
        result_20.m_backend.data._M_elems[9]._1_3_ = 0;
        result_20.m_backend.exp = 0;
        result_20.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_20.m_backend,
                   &(this->vec).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)&(((pIVar11->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val).m_backend.data + lVar12 + -4)].m_backend,
                   &eps.m_backend);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&bias.m_backend,&result_20.m_backend);
        result_20.m_backend.fpclass = cpp_dec_float_finite;
        result_20.m_backend.prec_elem = 10;
        result_20.m_backend.data._M_elems[0] = 0;
        result_20.m_backend.data._M_elems[1] = 0;
        result_20.m_backend.data._M_elems[2] = 0;
        result_20.m_backend.data._M_elems[3] = 0;
        result_20.m_backend.data._M_elems[4] = 0;
        result_20.m_backend.data._M_elems[5] = 0;
        result_20.m_backend.data._M_elems._24_5_ = 0;
        result_20.m_backend.data._M_elems[7]._1_3_ = 0;
        result_20.m_backend.data._M_elems._32_5_ = 0;
        result_20.m_backend.data._M_elems[9]._1_3_ = 0;
        result_20.m_backend.exp = 0;
        result_20.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_20.m_backend,&eps.m_backend,&eps.m_backend);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&len.m_backend,&result_20.m_backend);
        lVar12 = lVar12 + -0x3c;
      }
      result_20.m_backend.data._M_elems._0_8_ =
           result_20.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar7 = boost::multiprecision::operator>(&len,(int *)&result_20.m_backend);
      if (tVar7) {
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,&bias.m_backend,&len.m_backend);
        result_23.m_backend.fpclass = cpp_dec_float_finite;
        result_23.m_backend.prec_elem = 10;
        result_23.m_backend.data._M_elems[0] = 0;
        result_23.m_backend.data._M_elems[1] = 0;
        result_23.m_backend.data._M_elems[2] = 0;
        result_23.m_backend.data._M_elems[3] = 0;
        result_23.m_backend.data._M_elems[4] = 0;
        result_23.m_backend.data._M_elems[5] = 0;
        result_23.m_backend.data._M_elems._24_5_ = 0;
        result_23.m_backend.data._M_elems[7]._1_3_ = 0;
        result_23.m_backend.data._M_elems._32_5_ = 0;
        result_23.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_23.m_backend,&result.m_backend,
                   &(base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&result_20.m_backend,(multiprecision *)&result_23,arg_00);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&(this->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).colWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend,&result_20.m_backend)
        ;
      }
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum !=
        (int)(((long)(this->vec).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vec).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x38))) {
LAB_002a7c3d:
      SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(&this->
                      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,base);
      return;
    }
    this_00 = &this->vec;
    this_01 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&eps.m_backend,base);
    bias.m_backend.fpclass = cpp_dec_float_finite;
    bias.m_backend.prec_elem = 10;
    bias.m_backend.data._M_elems[0] = 0;
    bias.m_backend.data._M_elems[1] = 0;
    bias.m_backend.data._M_elems[2] = 0;
    bias.m_backend.data._M_elems[3] = 0;
    bias.m_backend.data._M_elems[4] = 0;
    bias.m_backend.data._M_elems[5] = 0;
    bias.m_backend.data._M_elems._24_5_ = 0;
    bias.m_backend.data._M_elems[7]._1_3_ = 0;
    bias.m_backend.data._M_elems._32_5_ = 0;
    bias.m_backend.data._M_elems[9]._1_3_ = 0;
    bias.m_backend.exp = 0;
    bias.m_backend.neg = false;
    len.m_backend.data._M_elems[0] = 10000;
    len.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&bias.m_backend,&eps.m_backend,(longlong *)&len);
    len.m_backend.fpclass = cpp_dec_float_finite;
    len.m_backend.prec_elem = 10;
    len.m_backend.data._M_elems[0] = 0;
    len.m_backend.data._M_elems[1] = 0;
    len.m_backend.data._M_elems[2] = 0;
    len.m_backend.data._M_elems[3] = 0;
    len.m_backend.data._M_elems[4] = 0;
    len.m_backend.data._M_elems[5] = 0;
    len.m_backend.data._M_elems._24_5_ = 0;
    len.m_backend.data._M_elems[7]._1_3_ = 0;
    len.m_backend.data._M_elems._32_5_ = 0;
    len.m_backend.data._M_elems[9]._1_3_ = 0;
    len.m_backend.exp = 0;
    len.m_backend.neg = false;
    result_20.m_backend.fpclass = cpp_dec_float_finite;
    result_20.m_backend.prec_elem = 10;
    result_20.m_backend.data._M_elems[0] = 0;
    result_20.m_backend.data._M_elems[1] = 0;
    result_20.m_backend.data._M_elems[2] = 0;
    result_20.m_backend.data._M_elems[3] = 0;
    result_20.m_backend.data._M_elems[4] = 0;
    result_20.m_backend.data._M_elems[5] = 0;
    result_20.m_backend.data._M_elems._24_5_ = 0;
    result_20.m_backend.data._M_elems[7]._1_3_ = 0;
    result_20.m_backend.data._M_elems._32_5_ = 0;
    result_20.m_backend.data._M_elems[9]._1_3_ = 0;
    result_20.m_backend.exp = 0;
    result_20.m_backend.neg = false;
    lVar9 = (long)(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    lVar10 = lVar9 * 0x38;
    while( true ) {
      if (lVar9 == 0) break;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(this_00->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10),
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10));
      len.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      len.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      len.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      len.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      len.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      len.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      len.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      len.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      len.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      len.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      len.m_backend.exp = result.m_backend.exp;
      len.m_backend.neg = result.m_backend.neg;
      len.m_backend.fpclass = result.m_backend.fpclass;
      len.m_backend.prec_elem = result.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10),
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(this_00->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10));
      result_20.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      result_20.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      result_20.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      result_20.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      result_20.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      result_20.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      result_20.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      result_20.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      result_20.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      result_20.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      result_20.m_backend.exp = result.m_backend.exp;
      result_20.m_backend.neg = result.m_backend.neg;
      result_20.m_backend.fpclass = result.m_backend.fpclass;
      result_20.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator<(&len,&result_20);
      if (tVar7) {
        result_2.m_backend.data._M_elems[0] = len.m_backend.data._M_elems[0];
        result_2.m_backend.data._M_elems[1] = len.m_backend.data._M_elems[1];
        uVar6 = result_2.m_backend.data._M_elems._0_8_;
        result_2.m_backend.data._M_elems[2] = len.m_backend.data._M_elems[2];
        result_2.m_backend.data._M_elems[3] = len.m_backend.data._M_elems[3];
        result_2.m_backend.data._M_elems._32_5_ = len.m_backend.data._M_elems._32_5_;
        result_2.m_backend.data._M_elems[9]._1_3_ = len.m_backend.data._M_elems[9]._1_3_;
        result_2.m_backend.data._M_elems[4] = len.m_backend.data._M_elems[4];
        result_2.m_backend.data._M_elems[5] = len.m_backend.data._M_elems[5];
        result_2.m_backend.data._M_elems._24_5_ = len.m_backend.data._M_elems._24_5_;
        result_2.m_backend.data._M_elems[7]._1_3_ = len.m_backend.data._M_elems[7]._1_3_;
        result_2.m_backend.exp = len.m_backend.exp;
        result_2.m_backend.neg = len.m_backend.neg;
        result_2.m_backend.fpclass = len.m_backend.fpclass;
        result_2.m_backend.prec_elem = len.m_backend.prec_elem;
        result_2.m_backend.data._M_elems[0] = len.m_backend.data._M_elems[0];
        if (len.m_backend.fpclass != cpp_dec_float_finite ||
            result_2.m_backend.data._M_elems[0] != 0) {
          result_2.m_backend.neg = (bool)(len.m_backend.neg ^ 1);
        }
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 10;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems._24_5_ = 0;
        result_3.m_backend.data._M_elems[7]._1_3_ = 0;
        result_3.m_backend.data._M_elems._32_5_ = 0;
        result_3.m_backend.data._M_elems[9]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        result_2.m_backend.data._M_elems._0_8_ = uVar6;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_3.m_backend,&bias.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(this_01->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10));
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,&result_2.m_backend,&result_3.m_backend);
        pnVar3 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).colWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x20) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._8_8_;
        *(int *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x28) = result.m_backend.exp;
        *(bool *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x2c) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x30) = result.m_backend._48_8_;
        bVar13 = false;
      }
      else {
        result_2.m_backend.data._M_elems[0] = result_20.m_backend.data._M_elems[0];
        result_2.m_backend.data._M_elems[1] = result_20.m_backend.data._M_elems[1];
        uVar6 = result_2.m_backend.data._M_elems._0_8_;
        result_2.m_backend.data._M_elems[2] = result_20.m_backend.data._M_elems[2];
        result_2.m_backend.data._M_elems[3] = result_20.m_backend.data._M_elems[3];
        result_2.m_backend.data._M_elems._32_5_ = result_20.m_backend.data._M_elems._32_5_;
        result_2.m_backend.data._M_elems[9]._1_3_ = result_20.m_backend.data._M_elems[9]._1_3_;
        result_2.m_backend.data._M_elems[4] = result_20.m_backend.data._M_elems[4];
        result_2.m_backend.data._M_elems[5] = result_20.m_backend.data._M_elems[5];
        result_2.m_backend.data._M_elems._24_5_ = result_20.m_backend.data._M_elems._24_5_;
        result_2.m_backend.data._M_elems[7]._1_3_ = result_20.m_backend.data._M_elems[7]._1_3_;
        result_2.m_backend.exp = result_20.m_backend.exp;
        result_2.m_backend.neg = result_20.m_backend.neg;
        result_2.m_backend.fpclass = result_20.m_backend.fpclass;
        result_2.m_backend.prec_elem = result_20.m_backend.prec_elem;
        result_2.m_backend.data._M_elems[0] = result_20.m_backend.data._M_elems[0];
        if (result_20.m_backend.fpclass != cpp_dec_float_finite ||
            result_2.m_backend.data._M_elems[0] != 0) {
          result_2.m_backend.neg = (bool)(result_20.m_backend.neg ^ 1);
        }
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 10;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems._24_5_ = 0;
        result_3.m_backend.data._M_elems[7]._1_3_ = 0;
        result_3.m_backend.data._M_elems._32_5_ = 0;
        result_3.m_backend.data._M_elems[9]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        result_2.m_backend.data._M_elems._0_8_ = uVar6;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_3.m_backend,&bias.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(this_01->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10));
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,&result_2.m_backend,&result_3.m_backend);
        pnVar3 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).colWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x20) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._8_8_;
        *(int *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x28) = result.m_backend.exp;
        *(bool *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x2c) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x30) = result.m_backend._48_8_;
        bVar13 = true;
      }
      (this->
      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).colUp.data[lVar9 + -1] = bVar13;
      lVar9 = lVar9 + -1;
      lVar10 = lVar10 + -0x38;
    }
    lVar9 = (long)(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    lVar10 = lVar9 * 0x38;
    while( true ) {
      if (lVar9 == 0) break;
      pIVar11 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar9 + -1].idx;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*(&result,this_00,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)pIVar11);
      result_20.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      result_20.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      result_20.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      result_20.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      result_20.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      result_20.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      result_20.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      result_20.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      result_20.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      result_20.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      result_20.m_backend.exp = result.m_backend.exp;
      result_20.m_backend.neg = result.m_backend.neg;
      result_20.m_backend.fpclass = result.m_backend.fpclass;
      result_20.m_backend.prec_elem = result.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&result_20.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10));
      len.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      len.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      len.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      len.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      len.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      len.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      len.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      len.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      len.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      len.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      len.m_backend.exp = result.m_backend.exp;
      len.m_backend.neg = result.m_backend.neg;
      len.m_backend.fpclass = result.m_backend.fpclass;
      len.m_backend.prec_elem = result.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10),
                 &result_20.m_backend);
      result_20.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      result_20.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      result_20.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      result_20.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      result_20.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      result_20.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      result_20.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      result_20.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      result_20.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      result_20.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      result_20.m_backend.exp = result.m_backend.exp;
      result_20.m_backend.neg = result.m_backend.neg;
      result_20.m_backend.fpclass = result.m_backend.fpclass;
      result_20.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator<
                        (&len,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result_20.m_backend);
      if (tVar7) {
        result_3.m_backend.data._M_elems[0] = len.m_backend.data._M_elems[0];
        result_3.m_backend.data._M_elems[1] = len.m_backend.data._M_elems[1];
        uVar6 = result_3.m_backend.data._M_elems._0_8_;
        result_3.m_backend.data._M_elems[2] = len.m_backend.data._M_elems[2];
        result_3.m_backend.data._M_elems[3] = len.m_backend.data._M_elems[3];
        result_3.m_backend.data._M_elems._32_5_ = len.m_backend.data._M_elems._32_5_;
        result_3.m_backend.data._M_elems[9]._1_3_ = len.m_backend.data._M_elems[9]._1_3_;
        result_3.m_backend.data._M_elems[4] = len.m_backend.data._M_elems[4];
        result_3.m_backend.data._M_elems[5] = len.m_backend.data._M_elems[5];
        result_3.m_backend.data._M_elems._24_5_ = len.m_backend.data._M_elems._24_5_;
        result_3.m_backend.data._M_elems[7]._1_3_ = len.m_backend.data._M_elems[7]._1_3_;
        result_3.m_backend.exp = len.m_backend.exp;
        result_3.m_backend.neg = len.m_backend.neg;
        result_3.m_backend.fpclass = len.m_backend.fpclass;
        result_3.m_backend.prec_elem = len.m_backend.prec_elem;
        result_3.m_backend.data._M_elems[0] = len.m_backend.data._M_elems[0];
        if (len.m_backend.fpclass != cpp_dec_float_finite ||
            result_3.m_backend.data._M_elems[0] != 0) {
          result_3.m_backend.neg = (bool)(len.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ =
             SEXT48((pIVar11->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused);
        result_11.m_backend.fpclass = cpp_dec_float_finite;
        result_11.m_backend.prec_elem = 10;
        result_11.m_backend.data._M_elems[0] = 0;
        result_11.m_backend.data._M_elems[1] = 0;
        result_11.m_backend.data._M_elems[2] = 0;
        result_11.m_backend.data._M_elems[3] = 0;
        result_11.m_backend.data._M_elems[4] = 0;
        result_11.m_backend.data._M_elems[5] = 0;
        result_11.m_backend.data._M_elems._24_5_ = 0;
        result_11.m_backend.data._M_elems[7]._1_3_ = 0;
        result_11.m_backend.data._M_elems._32_5_ = 0;
        result_11.m_backend._37_8_ = 0;
        result_3.m_backend.data._M_elems._0_8_ = uVar6;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (&result_11.m_backend,&eps.m_backend,(longlong *)&result);
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_2.m_backend,&result_3.m_backend,&result_11.m_backend);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_68,this_01,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar11);
        result_13.m_backend.fpclass = cpp_dec_float_finite;
        result_13.m_backend.prec_elem = 10;
        result_13.m_backend.data._M_elems[0] = 0;
        result_13.m_backend.data._M_elems[1] = 0;
        result_13.m_backend.data._M_elems[2] = 0;
        result_13.m_backend.data._M_elems[3] = 0;
        result_13.m_backend.data._M_elems[4] = 0;
        result_13.m_backend.data._M_elems[5] = 0;
        result_13.m_backend.data._M_elems._24_5_ = 0;
        result_13.m_backend.data._M_elems[7]._1_3_ = 0;
        result_13.m_backend.data._M_elems._32_5_ = 0;
        result_13.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_13.m_backend,&bias.m_backend,&local_68);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,&result_2.m_backend,&result_13.m_backend);
        pnVar3 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).rowWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x20) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._8_8_;
        *(int *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x28) = result.m_backend.exp;
        *(bool *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x2c) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x30) = result.m_backend._48_8_;
        bVar13 = false;
      }
      else {
        result_3.m_backend.data._M_elems[0] = result_20.m_backend.data._M_elems[0];
        result_3.m_backend.data._M_elems[1] = result_20.m_backend.data._M_elems[1];
        uVar6 = result_3.m_backend.data._M_elems._0_8_;
        result_3.m_backend.data._M_elems[2] = result_20.m_backend.data._M_elems[2];
        result_3.m_backend.data._M_elems[3] = result_20.m_backend.data._M_elems[3];
        result_3.m_backend.data._M_elems._32_5_ = result_20.m_backend.data._M_elems._32_5_;
        result_3.m_backend.data._M_elems[9]._1_3_ = result_20.m_backend.data._M_elems[9]._1_3_;
        result_3.m_backend.data._M_elems[4] = result_20.m_backend.data._M_elems[4];
        result_3.m_backend.data._M_elems[5] = result_20.m_backend.data._M_elems[5];
        result_3.m_backend.data._M_elems._24_5_ = result_20.m_backend.data._M_elems._24_5_;
        result_3.m_backend.data._M_elems[7]._1_3_ = result_20.m_backend.data._M_elems[7]._1_3_;
        result_3.m_backend.exp = result_20.m_backend.exp;
        result_3.m_backend.neg = result_20.m_backend.neg;
        result_3.m_backend.fpclass = result_20.m_backend.fpclass;
        result_3.m_backend.prec_elem = result_20.m_backend.prec_elem;
        result_3.m_backend.data._M_elems[0] = result_20.m_backend.data._M_elems[0];
        if (result_20.m_backend.fpclass != cpp_dec_float_finite ||
            result_3.m_backend.data._M_elems[0] != 0) {
          result_3.m_backend.neg = (bool)(result_20.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ =
             SEXT48((pIVar11->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused);
        result_11.m_backend.fpclass = cpp_dec_float_finite;
        result_11.m_backend.prec_elem = 10;
        result_11.m_backend.data._M_elems[0] = 0;
        result_11.m_backend.data._M_elems[1] = 0;
        result_11.m_backend.data._M_elems[2] = 0;
        result_11.m_backend.data._M_elems[3] = 0;
        result_11.m_backend.data._M_elems[4] = 0;
        result_11.m_backend.data._M_elems[5] = 0;
        result_11.m_backend.data._M_elems._24_5_ = 0;
        result_11.m_backend.data._M_elems[7]._1_3_ = 0;
        result_11.m_backend.data._M_elems._32_5_ = 0;
        result_11.m_backend._37_8_ = 0;
        result_3.m_backend.data._M_elems._0_8_ = uVar6;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (&result_11.m_backend,&eps.m_backend,(longlong *)&result);
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_2.m_backend,&result_3.m_backend,&result_11.m_backend);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_68,this_01,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar11);
        result_13.m_backend.fpclass = cpp_dec_float_finite;
        result_13.m_backend.prec_elem = 10;
        result_13.m_backend.data._M_elems[0] = 0;
        result_13.m_backend.data._M_elems[1] = 0;
        result_13.m_backend.data._M_elems[2] = 0;
        result_13.m_backend.data._M_elems[3] = 0;
        result_13.m_backend.data._M_elems[4] = 0;
        result_13.m_backend.data._M_elems[5] = 0;
        result_13.m_backend.data._M_elems._24_5_ = 0;
        result_13.m_backend.data._M_elems[7]._1_3_ = 0;
        result_13.m_backend.data._M_elems._32_5_ = 0;
        result_13.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_13.m_backend,&bias.m_backend,&local_68);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,&result_2.m_backend,&result_13.m_backend);
        pnVar3 = (this->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).rowWeight.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x20) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_)
        ;
        puVar2 = (uint *)((long)&pnVar3[-1].m_backend.data + lVar10);
        *(undefined8 *)puVar2 = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._8_8_;
        *(int *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x28) = result.m_backend.exp;
        *(bool *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x2c) = result.m_backend.neg;
        *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar10 + 0x30) = result.m_backend._48_8_;
        bVar13 = true;
      }
      (this->
      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).rowRight.data[lVar9 + -1] = bVar13;
      lVar9 = lVar9 + -1;
      lVar10 = lVar10 + -0x38;
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}